

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O1

void __thiscall
arangodb::velocypack::Validator::validateCompactObject(Validator *this,uint8_t *ptr,size_t length)

{
  byte *ptr_00;
  byte bVar1;
  ValueLength VVar2;
  int64_t iVar3;
  ValueLength length_00;
  ulong uVar4;
  Exception *this_00;
  char *msg;
  byte *ptr_01;
  byte *pbVar5;
  Slice key;
  byte *local_50;
  Validator *local_48;
  byte *local_40;
  byte *local_38;
  
  local_48 = this;
  validateBufferLength(this,5,length,true);
  local_50 = ptr + 1;
  VVar2 = ReadVariableLengthValue<false>(&local_50,ptr + length + 1);
  ptr_01 = local_50;
  if ((VVar2 <= length) && (4 < VVar2)) {
    local_50 = ptr + (VVar2 - 1);
    VVar2 = ReadVariableLengthValue<true>(&local_50,ptr + VVar2);
    if (VVar2 != 0) {
      pbVar5 = local_50 + 1;
      local_50 = ptr_01;
      do {
        if (pbVar5 <= ptr_01) {
          local_50 = ptr_01;
          this_00 = (Exception *)__cxa_allocate_exception(0x18);
          msg = "Object items number is out of bounds";
          goto LAB_00104a19;
        }
        validatePart(local_48,ptr_01,(long)pbVar5 - (long)ptr_01,true);
        bVar1 = *ptr_01;
        local_40 = ptr_01;
        if (0x7f < (ulong)bVar1 - 0x40) {
          if ((bVar1 & 0xf0) == 0x30) {
            iVar3 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getSmallInt
                              ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                *)&local_40);
            if (iVar3 < 1) {
LAB_00104a00:
              local_50 = ptr_01;
              this_00 = (Exception *)__cxa_allocate_exception(0x18);
              msg = "Invalid object key type";
              goto LAB_00104a19;
            }
          }
          else if ((bVar1 & 0xf8) != 0x28) goto LAB_00104a00;
        }
        length_00 = (ValueLength)"\x01\x01"[*local_40];
        if (length_00 == 0) {
          length_00 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                      byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                       *)&local_40,local_40);
        }
        if (((ulong)bVar1 - 0x40 < 0x80) && (local_48->options->validateUtf8Strings == true)) {
          validatePart(local_48,ptr_01,length_00,true);
        }
        ptr_00 = ptr_01 + length_00;
        validatePart(local_48,ptr_00,(long)pbVar5 - (long)ptr_00,true);
        uVar4 = (ulong)"\x01\x01"[ptr_01[length_00]];
        local_38 = ptr_00;
        if (uVar4 == 0) {
          uVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&local_38,ptr_00);
        }
        VVar2 = VVar2 - 1;
        ptr_01 = ptr_00 + uVar4;
      } while (VVar2 != 0);
      if (ptr_01 == pbVar5) {
        return;
      }
      local_50 = ptr_01;
      this_00 = (Exception *)__cxa_allocate_exception(0x18);
      msg = "Object has more members than specified";
      goto LAB_00104a19;
    }
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  msg = "Object length value is out of bounds";
LAB_00104a19:
  Exception::Exception(this_00,ValidatorInvalidLength,msg);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateCompactObject(uint8_t const* ptr, std::size_t length) {
  // compact Object without index table
  validateBufferLength(5, length, true);

  uint8_t const* p = ptr + 1;
  // read byteLength
  ValueLength const byteSize = ReadVariableLengthValue<false>(p, p + length);
  if (byteSize > length || byteSize < 5) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length value is out of bounds");
  }

  // read nrItems
  uint8_t const* data = p;
  p = ptr + byteSize - 1;
  ValueLength nrItems = ReadVariableLengthValue<true>(p, ptr + byteSize);
  if (nrItems == 0) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object length value is out of bounds");
  }
  ++p;

  // validate the object members
  uint8_t const* e = p;
  p = data;
  while (nrItems-- > 0) {
    if (p >= e) {
      throw Exception(Exception::ValidatorInvalidLength,
                      "Object items number is out of bounds");
    }
    // validate key
    validatePart(p, e - p, true);
    Slice key(p);
    bool isString = key.isString();
    if (!isString) {
      bool const isSmallInt = key.isSmallInt();
      if ((!isSmallInt && !key.isUInt()) ||
          (isSmallInt && key.getSmallInt() <= 0)) {
        throw Exception(Exception::ValidatorInvalidLength,
                        "Invalid object key type");
      }
    }
    ValueLength keySize = key.byteSize();
    // validate key
    if (isString && options->validateUtf8Strings) {
      validatePart(p, keySize, true);
    }

    // validate value
    p += keySize;
    validatePart(p, e - p, true);
    p += Slice(p).byteSize();
  }

  // finally check if we are now pointing at the end or not
  if (p != e) {
    throw Exception(Exception::ValidatorInvalidLength,
                    "Object has more members than specified");
  }
}